

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownPrefixFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  bool bVar1;
  BoundFunctionExpression *pBVar2;
  reference pvVar3;
  pointer pEVar4;
  BoundColumnRefExpression *pBVar5;
  BoundConstantExpression *pBVar6;
  string *psVar7;
  const_reference col_idx;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  FilterPushdownResult FVar8;
  ExpressionType local_e9;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_e8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_e0;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_d8;
  TableFilter *local_d0;
  string prefix_string;
  string local_a8;
  string local_88;
  Value local_68;
  
  FVar8 = NO_PUSHDOWN;
  if ((expr->super_BaseExpression).expression_class == BOUND_FUNCTION) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&expr->super_BaseExpression);
    bVar1 = ::std::operator!=(&(pBVar2->function).super_BaseScalarFunction.super_SimpleFunction.
                               super_Function.name,"prefix");
    if (!bVar1) {
      this_00 = &pBVar2->children;
      FVar8 = NO_PUSHDOWN;
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_00,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      if ((pEVar4->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,1);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        if ((pEVar4->super_BaseExpression).type == VALUE_CONSTANT) {
          FVar8 = NO_PUSHDOWN;
          pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::get<true>(this_00,0);
          pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar3);
          pBVar5 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                             (&pEVar4->super_BaseExpression);
          pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::get<true>(this_00,1);
          pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar3);
          pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar4->super_BaseExpression);
          psVar7 = StringValue::Get_abi_cxx11_(&pBVar6->value);
          ::std::__cxx11::string::string((string *)&prefix_string,(string *)psVar7);
          if (prefix_string._M_string_length != 0) {
            col_idx = vector<duckdb::ColumnIndex,_true>::get<true>
                                (column_ids,(pBVar5->binding).column_index);
            local_e8._M_head_impl._0_1_ = 0x1e;
            ::std::__cxx11::string::string((string *)&local_88,(string *)&prefix_string);
            Value::Value(&local_68,&local_88);
            make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value>
                      ((duckdb *)&local_d0,(ExpressionType *)&local_e8,&local_68);
            Value::~Value(&local_68);
            ::std::__cxx11::string::~string((string *)&local_88);
            prefix_string._M_dataplus._M_p[prefix_string._M_string_length - 1] =
                 prefix_string._M_dataplus._M_p[prefix_string._M_string_length - 1] + '\x01';
            local_e9 = COMPARE_LESSTHAN;
            ::std::__cxx11::string::string((string *)&local_a8,(string *)&prefix_string);
            Value::Value(&local_68,&local_a8);
            make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value>
                      ((duckdb *)&local_e8,&local_e9,&local_68);
            Value::~Value(&local_68);
            ::std::__cxx11::string::~string((string *)&local_a8);
            local_d8._M_head_impl = local_d0;
            local_d0 = (TableFilter *)0x0;
            TableFilterSet::PushFilter
                      (table_filters,col_idx,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_d8);
            if (local_d8._M_head_impl != (TableFilter *)0x0) {
              (*(local_d8._M_head_impl)->_vptr_TableFilter[1])();
            }
            local_e0._M_head_impl = local_e8._M_head_impl;
            local_d8._M_head_impl = (TableFilter *)0x0;
            local_e8._M_head_impl = (TableFilter *)0x0;
            TableFilterSet::PushFilter
                      (table_filters,col_idx,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_e0);
            if (local_e0._M_head_impl != (TableFilter *)0x0) {
              (*(local_e0._M_head_impl)->_vptr_TableFilter[1])();
            }
            local_e0._M_head_impl = (TableFilter *)0x0;
            if (local_e8._M_head_impl != (TableFilter *)0x0) {
              (*(local_e8._M_head_impl)->_vptr_TableFilter[1])();
            }
            if (local_d0 != (TableFilter *)0x0) {
              (*local_d0->_vptr_TableFilter[1])();
            }
            FVar8 = PUSHED_DOWN_FULLY;
          }
          ::std::__cxx11::string::~string((string *)&prefix_string);
        }
      }
    }
  }
  return FVar8;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownPrefixFilter(TableFilterSet &table_filters,
                                                             const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_FUNCTION) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &func = expr.Cast<BoundFunctionExpression>();
	if (func.function.name != "prefix") {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	if (func.children[0]->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF ||
	    func.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
		// we need prefix(col, 'literal') in order to push this down
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &column_ref = func.children[0]->Cast<BoundColumnRefExpression>();
	auto &constant_value_expr = func.children[1]->Cast<BoundConstantExpression>();
	auto prefix_string = StringValue::Get(constant_value_expr.value);
	if (prefix_string.empty()) {
		// empty prefix - skip
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &column_index = column_ids[column_ref.binding.column_index];
	//! Replace prefix with a set of comparisons
	auto lower_bound = make_uniq<ConstantFilter>(ExpressionType::COMPARE_GREATERTHANOREQUALTO, Value(prefix_string));
	prefix_string[prefix_string.size() - 1]++;
	auto upper_bound = make_uniq<ConstantFilter>(ExpressionType::COMPARE_LESSTHAN, Value(prefix_string));
	table_filters.PushFilter(column_index, std::move(lower_bound));
	table_filters.PushFilter(column_index, std::move(upper_bound));
	return FilterPushdownResult::PUSHED_DOWN_FULLY;
}